

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

ON_PolynomialCurve * __thiscall
ON_PolynomialCurve::operator=(ON_PolynomialCurve *this,ON_PolynomialCurve *src)

{
  ON_PolynomialCurve *src_local;
  ON_PolynomialCurve *this_local;
  
  if (this != src) {
    this->m_dim = src->m_dim;
    this->m_is_rat = src->m_is_rat;
    this->m_order = src->m_order;
    ON_4dPointArray::operator=(&this->m_cv,&src->m_cv);
    (this->m_domain).m_t[0] = (src->m_domain).m_t[0];
    (this->m_domain).m_t[1] = (src->m_domain).m_t[1];
  }
  return this;
}

Assistant:

ON_PolynomialCurve& ON_PolynomialCurve::operator=(const ON_PolynomialCurve& src)
{
  if ( this != &src ) {
    m_dim = src.m_dim;
    m_is_rat = src.m_is_rat;
    m_order = src.m_order;
    m_cv = src.m_cv;
    m_domain = src.m_domain;
  }
  return *this;
}